

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quantile.cpp
# Opt level: O2

void duckdb::QuantileScalarOperation<true,duckdb::QuantileStandardType>::
     Window<duckdb::QuantileState<signed_char,duckdb::QuantileStandardType>,signed_char,signed_char>
               (AggregateInputData *aggr_input_data,WindowPartitionInput *partition,
               const_data_ptr_t g_state,data_ptr_t l_state,SubFrames *frames,Vector *result,
               idx_t ridx)

{
  long lVar1;
  bool bVar2;
  char cVar3;
  CursorType *data;
  idx_t n;
  FunctionData *pFVar4;
  reference q;
  type this;
  WindowQuantileState<signed_char> *this_00;
  QuantileIncluded<signed_char> included;
  QuantileIncluded<signed_char> local_40;
  
  data = QuantileState<signed_char,_duckdb::QuantileStandardType>::GetOrCreateWindowCursor
                   ((QuantileState<signed_char,_duckdb::QuantileStandardType> *)l_state,partition);
  local_40.fmask = *(ValidityMask **)(partition + 0x58);
  local_40.dmask = data;
  n = QuantileOperation::FrameSize<signed_char>(&local_40,frames);
  pFVar4 = optional_ptr<duckdb::FunctionData,_true>::operator->(&aggr_input_data->bind_data);
  lVar1 = *(long *)(result + 0x20);
  FlatVector::VerifyFlatVector(result);
  if (n == 0) {
    TemplatedValidityMask<unsigned_long>::SetInvalid
              ((TemplatedValidityMask<unsigned_long> *)(result + 0x28),ridx);
  }
  else {
    q = vector<duckdb::QuantileValue,_true>::get<true>
                  ((vector<duckdb::QuantileValue,_true> *)(pFVar4 + 8),0);
    if ((g_state != (const_data_ptr_t)0x0) &&
       (bVar2 = QuantileState<signed_char,_duckdb::QuantileStandardType>::HasTree
                          ((QuantileState<signed_char,_duckdb::QuantileStandardType> *)g_state),
       bVar2)) {
      this = unique_ptr<duckdb::WindowQuantileState<signed_char>,_std::default_delete<duckdb::WindowQuantileState<signed_char>_>,_true>
             ::operator*((unique_ptr<duckdb::WindowQuantileState<signed_char>,_std::default_delete<duckdb::WindowQuantileState<signed_char>_>,_true>
                          *)(g_state + 0x18));
      cVar3 = WindowQuantileState<signed_char>::WindowScalar<signed_char,true>
                        (this,data,frames,n,result,q);
      *(char *)(lVar1 + ridx) = cVar3;
      return;
    }
    this_00 = QuantileState<signed_char,_duckdb::QuantileStandardType>::GetOrCreateWindowState
                        ((QuantileState<signed_char,_duckdb::QuantileStandardType> *)l_state);
    WindowQuantileState<signed_char>::UpdateSkip(this_00,data,frames,&local_40);
    cVar3 = WindowQuantileState<signed_char>::WindowScalar<signed_char,true>
                      (this_00,data,frames,n,result,q);
    *(char *)(lVar1 + ridx) = cVar3;
    std::vector<duckdb::FrameBounds,_std::allocator<duckdb::FrameBounds>_>::operator=
              (&(this_00->prevs).
                super_vector<duckdb::FrameBounds,_std::allocator<duckdb::FrameBounds>_>,
               &frames->super_vector<duckdb::FrameBounds,_std::allocator<duckdb::FrameBounds>_>);
  }
  return;
}

Assistant:

static void Window(AggregateInputData &aggr_input_data, const WindowPartitionInput &partition,
	                   const_data_ptr_t g_state, data_ptr_t l_state, const SubFrames &frames, Vector &result,
	                   idx_t ridx) {
		auto &state = *reinterpret_cast<STATE *>(l_state);
		auto gstate = reinterpret_cast<const STATE *>(g_state);

		auto &data = state.GetOrCreateWindowCursor(partition);
		const auto &fmask = partition.filter_mask;

		QuantileIncluded<INPUT_TYPE> included(fmask, data);
		const auto n = FrameSize(included, frames);

		D_ASSERT(aggr_input_data.bind_data);
		auto &bind_data = aggr_input_data.bind_data->Cast<QuantileBindData>();

		auto rdata = FlatVector::GetData<RESULT_TYPE>(result);
		auto &rmask = FlatVector::Validity(result);

		if (!n) {
			rmask.Set(ridx, false);
			return;
		}

		const auto &quantile = bind_data.quantiles[0];
		if (gstate && gstate->HasTree()) {
			rdata[ridx] = gstate->GetWindowState().template WindowScalar<RESULT_TYPE, DISCRETE>(data, frames, n, result,
			                                                                                    quantile);
		} else {
			auto &window_state = state.GetOrCreateWindowState();

			//	Update the skip list
			window_state.UpdateSkip(data, frames, included);

			// Find the position(s) needed
			rdata[ridx] = window_state.template WindowScalar<RESULT_TYPE, DISCRETE>(data, frames, n, result, quantile);

			//	Save the previous state for next time
			window_state.prevs = frames;
		}
	}